

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMemGrow(Mem *pMem,int n,int bPreserve)

{
  sqlite3 *psVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  
  uVar2 = 0x20;
  if (0x20 < n) {
    uVar2 = n;
  }
  if (bPreserve == 0 || pMem->szMalloc < 1) {
    if (0 < pMem->szMalloc) {
      pcVar4 = pMem->zMalloc;
      goto LAB_0014b966;
    }
  }
  else {
    pcVar4 = pMem->zMalloc;
    if (pMem->z == pcVar4) {
      pcVar4 = (char *)sqlite3DbReallocOrFree(pMem->db,pMem->z,(ulong)uVar2);
      pMem->zMalloc = pcVar4;
      pMem->z = pcVar4;
      bVar5 = true;
      goto LAB_0014b997;
    }
LAB_0014b966:
    sqlite3DbFreeNN(pMem->db,pcVar4);
  }
  if (pMem->db == (sqlite3 *)0x0) {
    pcVar4 = (char *)sqlite3Malloc((ulong)uVar2);
  }
  else {
    pcVar4 = (char *)sqlite3DbMallocRawNN(pMem->db,(ulong)uVar2);
  }
  pMem->zMalloc = pcVar4;
  bVar5 = bPreserve == 0;
LAB_0014b997:
  if (pcVar4 == (char *)0x0) {
    if ((pMem->flags & 0x2400) == 0) {
      pMem->flags = 1;
    }
    else {
      vdbeMemClearExternAndSetNull(pMem);
    }
    pMem->z = (char *)0x0;
    pMem->szMalloc = 0;
    iVar3 = 7;
  }
  else {
    psVar1 = pMem->db;
    if (((psVar1 == (sqlite3 *)0x0) || (pcVar4 < (psVar1->lookaside).pStart)) ||
       ((psVar1->lookaside).pEnd <= pcVar4)) {
      uVar2 = (*sqlite3Config.m.xSize)(pcVar4);
    }
    else {
      uVar2 = (uint)(psVar1->lookaside).sz;
    }
    pMem->szMalloc = uVar2;
    if ((!bVar5) && (pMem->z != (char *)0x0)) {
      memcpy(pMem->zMalloc,pMem->z,(long)pMem->n);
    }
    uVar2._0_2_ = pMem->flags;
    uVar2._2_1_ = pMem->enc;
    uVar2._3_1_ = pMem->eSubtype;
    if ((uVar2 >> 10 & 1) != 0) {
      (*pMem->xDel)(pMem->z);
      uVar2._0_2_ = pMem->flags;
    }
    pMem->z = pMem->zMalloc;
    pMem->flags = (ushort)uVar2 & 0xe3ff;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int sqlite3VdbeMemGrow(Mem *pMem, int n, int bPreserve){
  assert( sqlite3VdbeCheckMemInvariants(pMem) );
  assert( !sqlite3VdbeMemIsRowSet(pMem) );
  testcase( pMem->db==0 );

  /* If the bPreserve flag is set to true, then the memory cell must already
  ** contain a valid string or blob value.  */
  assert( bPreserve==0 || pMem->flags&(MEM_Blob|MEM_Str) );
  testcase( bPreserve && pMem->z==0 );

  assert( pMem->szMalloc==0
       || pMem->szMalloc==sqlite3DbMallocSize(pMem->db, pMem->zMalloc) );
  if( n<32 ) n = 32;
  if( pMem->szMalloc>0 && bPreserve && pMem->z==pMem->zMalloc ){
    pMem->z = pMem->zMalloc = sqlite3DbReallocOrFree(pMem->db, pMem->z, n);
    bPreserve = 0;
  }else{
    if( pMem->szMalloc>0 ) sqlite3DbFreeNN(pMem->db, pMem->zMalloc);
    pMem->zMalloc = sqlite3DbMallocRaw(pMem->db, n);
  }
  if( pMem->zMalloc==0 ){
    sqlite3VdbeMemSetNull(pMem);
    pMem->z = 0;
    pMem->szMalloc = 0;
    return SQLITE_NOMEM_BKPT;
  }else{
    pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->zMalloc);
  }

  if( bPreserve && pMem->z ){
    assert( pMem->z!=pMem->zMalloc );
    memcpy(pMem->zMalloc, pMem->z, pMem->n);
  }
  if( (pMem->flags&MEM_Dyn)!=0 ){
    assert( pMem->xDel!=0 && pMem->xDel!=SQLITE_DYNAMIC );
    pMem->xDel((void *)(pMem->z));
  }

  pMem->z = pMem->zMalloc;
  pMem->flags &= ~(MEM_Dyn|MEM_Ephem|MEM_Static);
  return SQLITE_OK;
}